

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O1

void __thiscall
gimage::HighDynamicRangeFusion<unsigned_short>::mulSaturationWeight
          (HighDynamicRangeFusion<unsigned_short> *this,ImageFloat *wp,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,float max_value)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (0 < image->height) {
    uVar1 = image->depth;
    fVar10 = (float)(int)uVar1;
    pfVar2 = **wp->img;
    lVar6 = 0;
    do {
      if (0 < image->width) {
        lVar5 = 0;
        pfVar4 = pfVar2;
        do {
          if ((int)uVar1 < 1) {
            fVar7 = 0.0;
            fVar8 = 0.0;
          }
          else {
            fVar8 = 0.0;
            uVar3 = 0;
            fVar7 = 0.0;
            do {
              fVar9 = (float)image->img[uVar3][lVar6][lVar5] * (1.0 / max_value);
              fVar8 = fVar8 + fVar9;
              fVar7 = fVar7 + fVar9 * fVar9;
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          fVar7 = (fVar7 - fVar10 * (fVar8 / fVar10) * (fVar8 / fVar10)) / fVar10;
          if (fVar7 <= 0.0) {
            fVar7 = 0.0;
          }
          if (fVar7 < 0.0) {
            fVar7 = sqrtf(fVar7);
          }
          else {
            fVar7 = SQRT(fVar7);
          }
          pfVar2 = pfVar4 + 1;
          *pfVar4 = fVar7 * *pfVar4;
          lVar5 = lVar5 + 1;
          pfVar4 = pfVar2;
        } while (lVar5 < image->width);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < image->height);
  }
  return;
}

Assistant:

void mulSaturationWeight(ImageFloat &wp, const Image<T> &image, float max_value)
    {
      float scale=1.0f/max_value;
      int n=image.getDepth();

      float *p=wp.getPtr(0, 0, 0);
      for (long k=0; k<image.getHeight(); k++)
      {
        for (long i=0; i<image.getWidth(); i++)
        {
          float ssum=0;
          float mean=0;

          for (int d=0; d<n; d++)
          {
            float v=scale*image.get(i, k, d);
            ssum+=v*v;
            mean+=v;
          }

          mean/=n;

          // multiply standard deviation of color values

          *p++ *= static_cast<float>(std::sqrt(std::max(0.0f, (ssum-n*mean*mean)/n)));
        }
      }
    }